

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int av1_handle_inter_intra_mode
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MB_MODE_INFO *mbmi,
              HandleInterModeArgs *args,int64_t ref_best_rd,int *rate_mv,int *tmp_rate2,
              BUFFER_SET *orig_dst)

{
  BUFFER_SET dst;
  _Bool _Var1;
  int iVar2;
  int *rate_mv_00;
  long in_RCX;
  BLOCK_SIZE in_DL;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int *in_stack_00000008;
  int *in_stack_00000010;
  undefined1 (*in_stack_00000018) [12];
  int ret_1;
  int rate_overhead;
  int tmp_rate_mv;
  int_mv tmp_mv;
  int_mv mv0;
  int64_t best_interintra_rd_wedge;
  int ret;
  int best_mode_rate;
  int64_t best_interintra_rd_nowedge;
  INTERINTRA_MODE best_interintra_mode;
  int num_planes;
  int mi_col;
  int mi_row;
  uint8_t *intrapred;
  uint8_t *tmp_buf;
  uint8_t intrapred_ [2048];
  uint8_t tmp_buf_ [2048];
  int bw;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int try_wedge_interintra;
  int is_wedge_used;
  int try_smooth_interintra;
  undefined4 in_stack_ffffffffffffeea8;
  undefined4 in_stack_ffffffffffffeeac;
  undefined4 in_stack_ffffffffffffeeb0;
  undefined4 in_stack_ffffffffffffeeb4;
  undefined8 in_stack_ffffffffffffeee0;
  BLOCK_SIZE bsize_00;
  BUFFER_SET *in_stack_ffffffffffffeee8;
  undefined1 *in_stack_ffffffffffffeef0;
  MACROBLOCKD *in_stack_ffffffffffffeef8;
  AV1_COMMON *in_stack_ffffffffffffef00;
  int in_stack_ffffffffffffef10;
  MACROBLOCKD *pMVar3;
  uint in_stack_ffffffffffffef18;
  undefined1 local_10e0 [32];
  MACROBLOCKD *local_10c0;
  undefined1 local_10b5;
  int local_10b4;
  int local_10b0;
  int local_10ac;
  uint8_t *local_10a8;
  int64_t in_stack_ffffffffffffef68;
  MB_MODE_INFO *in_stack_ffffffffffffef70;
  BLOCK_SIZE in_stack_ffffffffffffef7f;
  MACROBLOCK *in_stack_ffffffffffffef80;
  AV1_COMP *in_stack_ffffffffffffef88;
  MB_MODE_INFO *in_stack_ffffffffffffef90;
  BLOCK_SIZE in_stack_ffffffffffffef9f;
  MACROBLOCK *in_stack_ffffffffffffefa0;
  AV1_COMP *in_stack_ffffffffffffefa8;
  INTERINTRA_MODE *in_stack_ffffffffffffefb0;
  int64_t *in_stack_ffffffffffffefb8;
  int *in_stack_ffffffffffffefc0;
  BUFFER_SET *in_stack_ffffffffffffefc8;
  int64_t *in_stack_ffffffffffffefd0;
  BUFFER_SET *in_stack_ffffffffffffefd8;
  HandleInterModeArgs *in_stack_ffffffffffffefe0;
  uint8_t *in_stack_ffffffffffffefe8;
  uint8_t *in_stack_ffffffffffffeff0;
  uint8_t *in_stack_ffffffffffffeff8;
  HandleInterModeArgs *in_stack_fffffffffffff000;
  int *in_stack_fffffffffffff008;
  int *in_stack_fffffffffffff010;
  int_mv *in_stack_fffffffffffff018;
  int64_t in_stack_fffffffffffff020;
  uint8_t local_898 [2060];
  uint local_8c;
  MACROBLOCKD *local_88;
  AV1_COMMON *local_80;
  uint local_74;
  int local_70;
  uint local_6c;
  long local_60;
  long local_58;
  BLOCK_SIZE local_49;
  long local_48;
  long local_40;
  int local_34;
  
  bsize_00 = (BLOCK_SIZE)((ulong)in_stack_ffffffffffffeee0 >> 0x38);
  local_6c = (uint)(*(byte *)(in_RDI + 0x426fa) & 1);
  local_60 = in_R8;
  local_58 = in_RCX;
  local_49 = in_DL;
  local_48 = in_RSI;
  local_40 = in_RDI;
  local_70 = av1_is_wedge_used(in_DL);
  in_stack_ffffffffffffef18 = in_stack_ffffffffffffef18 & 0xffffff;
  if (local_70 != 0) {
    _Var1 = enable_wedge_interintra_search
                      ((MACROBLOCK *)CONCAT44(in_stack_ffffffffffffeeb4,in_stack_ffffffffffffeeb0),
                       (AV1_COMP *)CONCAT44(in_stack_ffffffffffffeeac,in_stack_ffffffffffffeea8));
    in_stack_ffffffffffffef18 = CONCAT13(_Var1,(int3)in_stack_ffffffffffffef18);
  }
  local_74 = in_stack_ffffffffffffef18 >> 0x18;
  local_80 = (AV1_COMMON *)(local_40 + 0x3bf80);
  local_88 = (MACROBLOCKD *)(local_48 + 0x1a0);
  local_8c = (uint)block_size_wide[local_49];
  rate_mv_00 = (int *)get_buf_by_bd(local_88,local_898);
  local_10a8 = get_buf_by_bd(local_88,&stack0xffffffffffffef68);
  local_10ac = local_88->mi_row;
  local_10b0 = local_88->mi_col;
  *(undefined1 *)(local_58 + 0x11) = 0xff;
  local_88->plane[0].dst.buf = (uint8_t *)rate_mv_00;
  local_88->plane[0].dst.stride = local_8c;
  av1_enc_build_inter_predictor
            (in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
             (int)((ulong)in_stack_ffffffffffffeef0 >> 0x20),(int)in_stack_ffffffffffffeef0,
             in_stack_ffffffffffffeee8,bsize_00,in_stack_ffffffffffffef10,in_stack_ffffffffffffef18)
  ;
  local_10b4 = av1_num_planes(local_80);
  dst.plane[1]._4_4_ = (int)((ulong)*(undefined8 *)(*in_stack_00000018 + 8) >> 0x20);
  dst.plane._0_12_ = *in_stack_00000018;
  dst.plane[2] = (uint8_t *)*(undefined8 *)(in_stack_00000018[1] + 4);
  dst.stride._0_8_ = *(undefined8 *)in_stack_00000018[2];
  dst._32_8_ = *(undefined8 *)(in_stack_00000018[2] + 8);
  restore_dst_buf(local_88,dst,local_10b4);
  *(undefined1 *)(local_58 + 0x11) = 0;
  local_10b5 = *(undefined1 *)(*(long *)(local_60 + 0x88) + (long)*(char *)(local_58 + 0x10));
  local_10c0 = (MACROBLOCKD *)0x7fffffffffffffff;
  local_10e0._28_4_ = 0x7fffffff;
  if ((local_6c == 0) ||
     (local_10e0._24_4_ =
           handle_smooth_inter_intra_mode
                     (in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,in_stack_ffffffffffffef7f,
                      in_stack_ffffffffffffef70,in_stack_ffffffffffffef68,rate_mv_00,
                      in_stack_ffffffffffffefb0,in_stack_ffffffffffffefb8,in_stack_ffffffffffffefc0,
                      in_stack_ffffffffffffefc8,(uint8_t *)in_stack_ffffffffffffefd0,
                      (uint8_t *)in_stack_ffffffffffffefd8,in_stack_ffffffffffffefe0),
     local_10e0._24_4_ != -1)) {
    local_10e0._16_8_ = (uint8_t *)0x7fffffffffffffff;
    local_10e0._8_4_ = *(undefined4 *)(local_58 + 8);
    local_10e0._4_4_ = 0;
    local_10e0._0_4_ = 0;
    local_10e0._12_4_ = local_10e0._8_4_;
    if (local_74 != 0) {
      bsize_00 = (BLOCK_SIZE)((ulong)(local_10e0 + 4) >> 0x38);
      in_stack_ffffffffffffeee8 = (BUFFER_SET *)local_10e0;
      in_stack_ffffffffffffeef0 = local_10e0 + 8;
      in_stack_ffffffffffffeef8 = local_10c0;
      pMVar3 = local_10c0;
      iVar2 = handle_wedge_inter_intra_mode
                        (in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,
                         in_stack_ffffffffffffef9f,in_stack_ffffffffffffef90,
                         (int *)in_stack_ffffffffffffef88,
                         (INTERINTRA_MODE *)in_stack_ffffffffffffef80,in_stack_ffffffffffffefd0,
                         in_stack_ffffffffffffefd8,(uint8_t *)in_stack_ffffffffffffefe0,
                         in_stack_ffffffffffffefe8,in_stack_ffffffffffffeff0,
                         in_stack_ffffffffffffeff8,in_stack_fffffffffffff000,
                         in_stack_fffffffffffff008,in_stack_fffffffffffff010,
                         in_stack_fffffffffffff018,in_stack_fffffffffffff020);
      in_stack_ffffffffffffef10 = (int)pMVar3;
      if (iVar2 == -1) {
        return -1;
      }
    }
    if ((local_10c0 == (MACROBLOCKD *)0x7fffffffffffffff) &&
       ((uint8_t *)local_10e0._16_8_ == (uint8_t *)0x7fffffffffffffff)) {
      local_34 = -1;
    }
    else {
      if ((long)local_10e0._16_8_ < (long)local_10c0) {
        *(undefined4 *)(local_58 + 8) = local_10e0._8_4_;
        *in_stack_00000010 = (local_10e0._4_4_ - *in_stack_00000008) + *in_stack_00000010;
        *in_stack_00000008 = local_10e0._4_4_;
        local_10e0._28_4_ = local_10e0._0_4_;
      }
      else if ((local_6c != 0) && (local_74 != 0)) {
        *(ushort *)(local_58 + 0xa7) = *(ushort *)(local_58 + 0xa7) & 0xfbff;
        *(undefined1 *)(local_58 + 0x40) = local_10b5;
        *(undefined4 *)(local_58 + 8) = local_10e0._12_4_;
        av1_enc_build_inter_predictor
                  (in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
                   (int)((ulong)in_stack_ffffffffffffeef0 >> 0x20),(int)in_stack_ffffffffffffeef0,
                   in_stack_ffffffffffffeee8,bsize_00,in_stack_ffffffffffffef10,
                   in_stack_ffffffffffffef18);
      }
      *in_stack_00000010 = local_10e0._28_4_ + *in_stack_00000010;
      if (1 < local_10b4) {
        av1_enc_build_inter_predictor
                  (in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8,
                   (int)((ulong)in_stack_ffffffffffffeef0 >> 0x20),(int)in_stack_ffffffffffffeef0,
                   in_stack_ffffffffffffeee8,bsize_00,in_stack_ffffffffffffef10,
                   in_stack_ffffffffffffef18);
      }
      local_34 = 0;
    }
  }
  else {
    local_34 = -1;
  }
  return local_34;
}

Assistant:

int av1_handle_inter_intra_mode(const AV1_COMP *const cpi, MACROBLOCK *const x,
                                BLOCK_SIZE bsize, MB_MODE_INFO *mbmi,
                                HandleInterModeArgs *args, int64_t ref_best_rd,
                                int *rate_mv, int *tmp_rate2,
                                const BUFFER_SET *orig_dst) {
  const int try_smooth_interintra =
      cpi->oxcf.comp_type_cfg.enable_smooth_interintra;

  const int is_wedge_used = av1_is_wedge_used(bsize);
  const int try_wedge_interintra =
      is_wedge_used && enable_wedge_interintra_search(x, cpi);

  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  const int bw = block_size_wide[bsize];
  DECLARE_ALIGNED(16, uint8_t, tmp_buf_[2 * MAX_INTERINTRA_SB_SQUARE]);
  DECLARE_ALIGNED(16, uint8_t, intrapred_[2 * MAX_INTERINTRA_SB_SQUARE]);
  uint8_t *tmp_buf = get_buf_by_bd(xd, tmp_buf_);
  uint8_t *intrapred = get_buf_by_bd(xd, intrapred_);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // Single reference inter prediction
  mbmi->ref_frame[1] = NONE_FRAME;
  xd->plane[0].dst.buf = tmp_buf;
  xd->plane[0].dst.stride = bw;
  av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                AOM_PLANE_Y, AOM_PLANE_Y);
  const int num_planes = av1_num_planes(cm);

  // Restore the buffers for intra prediction
  restore_dst_buf(xd, *orig_dst, num_planes);
  mbmi->ref_frame[1] = INTRA_FRAME;
  INTERINTRA_MODE best_interintra_mode =
      args->inter_intra_mode[mbmi->ref_frame[0]];

  // Compute smooth_interintra
  int64_t best_interintra_rd_nowedge = INT64_MAX;
  int best_mode_rate = INT_MAX;
  if (try_smooth_interintra) {
    int ret = handle_smooth_inter_intra_mode(
        cpi, x, bsize, mbmi, ref_best_rd, rate_mv, &best_interintra_mode,
        &best_interintra_rd_nowedge, &best_mode_rate, orig_dst, tmp_buf,
        intrapred, args);
    if (ret == IGNORE_MODE) {
      return IGNORE_MODE;
    }
  }

  // Compute wedge interintra
  int64_t best_interintra_rd_wedge = INT64_MAX;
  const int_mv mv0 = mbmi->mv[0];
  int_mv tmp_mv = mv0;
  int tmp_rate_mv = 0;
  int rate_overhead = 0;
  if (try_wedge_interintra) {
    int ret = handle_wedge_inter_intra_mode(
        cpi, x, bsize, mbmi, rate_mv, &best_interintra_mode,
        &best_interintra_rd_wedge, orig_dst, tmp_buf_, tmp_buf, intrapred_,
        intrapred, args, &tmp_rate_mv, &rate_overhead, &tmp_mv,
        best_interintra_rd_nowedge);
    if (ret == IGNORE_MODE) {
      return IGNORE_MODE;
    }
  }

  if (best_interintra_rd_nowedge == INT64_MAX &&
      best_interintra_rd_wedge == INT64_MAX) {
    return IGNORE_MODE;
  }
  if (best_interintra_rd_wedge < best_interintra_rd_nowedge) {
    mbmi->mv[0].as_int = tmp_mv.as_int;
    *tmp_rate2 += tmp_rate_mv - *rate_mv;
    *rate_mv = tmp_rate_mv;
    best_mode_rate = rate_overhead;
  } else if (try_smooth_interintra && try_wedge_interintra) {
    // If smooth was best, but we over-wrote the values when evaluating the
    // wedge mode, we need to recompute the smooth values.
    mbmi->use_wedge_interintra = 0;
    mbmi->interintra_mode = best_interintra_mode;
    mbmi->mv[0].as_int = mv0.as_int;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
  }
  *tmp_rate2 += best_mode_rate;

  if (num_planes > 1) {
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                  AOM_PLANE_U, num_planes - 1);
  }
  return 0;
}